

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O3

void __thiscall
vkt::wsi::anon_unknown_0::NativeObjects::NativeObjects
          (NativeObjects *this,Context *context,Extensions *supportedExtensions,Type wsiType,
          Maybe<tcu::Vector<unsigned_int,_2>_> *initialWindowSize)

{
  long *plVar1;
  Display *pDVar2;
  Window *pWVar3;
  
  plVar1 = (long *)(*(code *)context->m_testCtx->m_curArchive)(context);
  pDVar2 = (Display *)(**(code **)(*plVar1 + 8))(plVar1,wsiType);
  (this->display).super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.
  ptr = pDVar2;
  pWVar3 = (Window *)(**(code **)(*(long *)pDVar2 + 0x10))(pDVar2,initialWindowSize);
  (this->window).super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr
       = pWVar3;
  return;
}

Assistant:

NativeObjects (Context&				context,
				   const Extensions&	supportedExtensions,
				   Type					wsiType,
				   const Maybe<UVec2>&	initialWindowSize = tcu::nothing<UVec2>())
		: display	(createDisplay(context.getTestContext().getPlatform().getVulkanPlatform(), supportedExtensions, wsiType))
		, window	(createWindow(*display, initialWindowSize))
	{}